

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_aa461::ChangeInstructionTo
               (VmModule *module,VmInstruction *inst,VmInstructionType cmd,VmValue *first,
               VmValue *second,VmValue *third,VmValue *fourth,VmValue *fifth,uint *optCount)

{
  bool bVar1;
  uint uVar2;
  VmValue **ppVVar3;
  uint local_460;
  uint i;
  undefined1 local_450 [8];
  SmallArray<VmValue_*,_128U> arguments;
  VmValue *third_local;
  VmValue *second_local;
  VmValue *first_local;
  VmInstructionType cmd_local;
  VmInstruction *inst_local;
  VmModule *module_local;
  
  inst->cmd = cmd;
  arguments.allocator = (Allocator *)third;
  SmallArray<VmValue_*,_128U>::SmallArray
            ((SmallArray<VmValue_*,_128U> *)local_450,module->allocator);
  uVar2 = SmallArray<VmValue_*,_4U>::size(&inst->arguments);
  SmallArray<VmValue_*,_128U>::reserve((SmallArray<VmValue_*,_128U> *)local_450,uVar2);
  ppVVar3 = (inst->arguments).data;
  uVar2 = SmallArray<VmValue_*,_4U>::size(&inst->arguments);
  SmallArray<VmValue_*,_128U>::push_back((SmallArray<VmValue_*,_128U> *)local_450,ppVVar3,uVar2);
  SmallArray<VmValue_*,_4U>::clear(&inst->arguments);
  if (first != (VmValue *)0x0) {
    VmInstruction::AddArgument(inst,first);
  }
  if (second != (VmValue *)0x0) {
    if (first == (VmValue *)0x0) {
      __assert_fail("first",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d2,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,second);
  }
  if (arguments.allocator != (Allocator *)0x0) {
    if (second == (VmValue *)0x0) {
      __assert_fail("second",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d8,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,(VmValue *)arguments.allocator);
  }
  if (fourth != (VmValue *)0x0) {
    if (arguments.allocator == (Allocator *)0x0) {
      __assert_fail("third",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3de,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,fourth);
  }
  if (fifth != (VmValue *)0x0) {
    if (fourth == (VmValue *)0x0) {
      __assert_fail("fourth",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3e4,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,fifth);
  }
  local_460 = 0;
  while( true ) {
    uVar2 = SmallArray<VmValue_*,_128U>::size((SmallArray<VmValue_*,_128U> *)local_450);
    if (uVar2 <= local_460) break;
    ppVVar3 = SmallArray<VmValue_*,_128U>::operator[]
                        ((SmallArray<VmValue_*,_128U> *)local_450,local_460);
    VmValue::RemoveUse(*ppVVar3,&inst->super_VmValue);
    local_460 = local_460 + 1;
  }
  bVar1 = HasSideEffects(cmd);
  (inst->super_VmValue).hasSideEffects = bVar1;
  bVar1 = HasMemoryAccess(cmd);
  (inst->super_VmValue).hasMemoryAccess = bVar1;
  if (optCount != (uint *)0x0) {
    *optCount = *optCount + 1;
  }
  SmallArray<VmValue_*,_128U>::~SmallArray((SmallArray<VmValue_*,_128U> *)local_450);
  return;
}

Assistant:

void ChangeInstructionTo(VmModule *module, VmInstruction *inst, VmInstructionType cmd, VmValue *first, VmValue *second, VmValue *third, VmValue *fourth, VmValue *fifth, unsigned *optCount)
	{
		inst->cmd = cmd;

		SmallArray<VmValue*, 128> arguments(module->allocator);
		arguments.reserve(inst->arguments.size());
		arguments.push_back(inst->arguments.data, inst->arguments.size());

		inst->arguments.clear();

		if(first)
			inst->AddArgument(first);

		if(second)
		{
			assert(first);
			inst->AddArgument(second);
		}

		if(third)
		{
			assert(second);
			inst->AddArgument(third);
		}

		if(fourth)
		{
			assert(third);
			inst->AddArgument(fourth);
		}

		if(fifth)
		{
			assert(fourth);
			inst->AddArgument(fifth);
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			arguments[i]->RemoveUse(inst);

		inst->hasSideEffects = HasSideEffects(cmd);
		inst->hasMemoryAccess = HasMemoryAccess(cmd);

		if(optCount)
			(*optCount)++;
	}